

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O2

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::generate_codebook
          (tree_clusterizer<crnlib::vec<2U,_float>_> *this,vec<2U,_float> *vectors,uint *weights,
          uint size,uint max_splits,bool generate_node_index_map,task_pool *pTask_pool)

{
  vector<crnlib::vec<2U,_float>_> *this_00;
  hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
  *this_01;
  node_vec_type *this_02;
  float fVar1;
  float fVar2;
  VectorInfo *pVVar3;
  ulong uVar4;
  bool bVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  vq_node *pvVar9;
  void *pData_ptr;
  undefined7 in_register_00000089;
  uint task;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  double dVar14;
  uint end_node;
  tree_clusterizer<crnlib::vec<2U,_float>_> *local_120;
  uint local_114;
  double local_110;
  ulong local_108;
  undefined4 local_100;
  float local_fc;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  node_queue;
  vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::split_alternative_node_task_params>
  params;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  alternative_node_queue;
  vq_node root;
  pair<crnlib::vec<2U,_float>,_int> local_3c;
  
  local_100 = (undefined4)CONCAT71(in_register_00000089,generate_node_index_map);
  this->m_vectors = vectors;
  vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::VectorInfo>::resize
            (&this->m_vectorsInfo,size,false);
  this_00 = &this->m_weightedVectors;
  vector<crnlib::vec<2U,_float>_>::resize(this_00,size,false);
  vector<double>::resize(&this->m_weightedDotProducts,size,false);
  vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::VectorInfo>::resize
            (&this->m_vectorsInfoLeft,size,false);
  vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::VectorInfo>::resize
            (&this->m_vectorsInfoRight,size,false);
  local_110 = (double)CONCAT44(local_110._4_4_,size);
  vector<bool>::resize(&this->m_vectorComparison,size,false);
  this_02 = &this->m_nodes;
  local_108 = (ulong)max_splits;
  vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::vq_node>::resize
            (this_02,max_splits * 4,false);
  local_120 = this;
  vector<crnlib::vec<2U,_float>_>::clear(&this->m_codebook);
  if (pTask_pool == (task_pool *)0x0) {
    local_114 = 1;
  }
  else {
    local_114 = pTask_pool->m_num_threads + 1;
  }
  root.m_centroid.m_s[0] = 0.0;
  root.m_centroid.m_s[1] = 0.0;
  root.m_total_weight = 0;
  root.m_left = -1;
  root.m_right = -1;
  root.m_codebook_index = -1;
  root.m_unsplittable = false;
  root.m_alternative = false;
  root.m_processed = false;
  root.m_begin = 0;
  root.m_end = local_110._0_4_;
  dVar14 = 0.0;
  lVar13 = 0;
  for (uVar6 = 0; uVar4 = local_108, uVar6 < (local_120->m_vectorsInfo).m_size; uVar6 = uVar6 + 1) {
    pVVar3 = (this->m_vectorsInfo).m_p;
    *(int *)((long)&pVVar3->index + lVar13) = (int)uVar6;
    uVar11 = *weights;
    *(uint *)((long)&pVVar3->weight + lVar13) = uVar11;
    local_fc = (float)uVar11;
    local_110 = dVar14;
    operator*((vec<2U,_float> *)((long)vectors->m_s + lVar13),local_fc);
    vec<2U,_float>::operator=
              ((vec<2U,_float> *)((long)this_00->m_p->m_s + lVar13),(vec<2U,_float> *)&node_queue);
    vec<2U,_float>::operator+=
              (&root.m_centroid,(vec<2U,_float> *)((long)this_00->m_p->m_s + lVar13));
    root.m_total_weight = uVar11 + root.m_total_weight;
    fVar1 = *(float *)((long)vectors->m_s + lVar13);
    fVar2 = *(float *)((long)vectors->m_s + lVar13 + 4);
    dVar14 = (double)((fVar2 * fVar2 + fVar1 * fVar1) * local_fc);
    *(double *)((long)(this->m_weightedDotProducts).m_p + lVar13) = dVar14;
    dVar14 = local_110 + dVar14;
    lVar13 = lVar13 + 8;
    weights = weights + 1;
  }
  uVar11 = (uint)local_108;
  root.m_variance =
       (float)(dVar14 - (double)((root.m_centroid.m_s[1] * root.m_centroid.m_s[1] +
                                 root.m_centroid.m_s[0] * root.m_centroid.m_s[0]) /
                                (float)root.m_total_weight));
  vec<2U,_float>::operator*=(&root.m_centroid,1.0 / (float)root.m_total_weight);
  node_queue.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  node_queue.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  node_queue.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  end_node = 0;
  vq_node::operator=(this_02->m_p,&root);
  alternative_node_queue.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = end_node;
  alternative_node_queue.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = root.m_variance;
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ::push(&node_queue,(value_type *)&alternative_node_queue);
  end_node = end_node + 1;
  if (local_114 < 2) {
    uVar8 = 1;
  }
  else {
    uVar6 = (ulong)local_114;
    uVar7 = 1;
    while (((uVar8 = uVar11 + (uVar11 == 0), uVar7 < uVar11 &&
            (uVar8 = uVar7,
            (long)node_queue.c.
                  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)node_queue.c.
                  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3 != uVar6)) &&
           (bVar5 = split_node(local_120,&node_queue,&end_node,pTask_pool), bVar5))) {
      uVar7 = uVar7 + 1;
    }
    if ((long)node_queue.c.
              super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)node_queue.c.
              super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar6) {
      std::
      vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
      ::vector(&alternative_node_queue.c,&node_queue.c);
      uVar7 = 0;
      uVar6 = (ulong)local_114;
      vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::split_alternative_node_task_params>
      ::vector(&params,local_114);
      uVar10 = uVar11 * 2;
      uVar12 = (uint)((uVar4 & 0xffffffff) / uVar6);
      while ((pointer)CONCAT44(alternative_node_queue.c.
                               super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               (uint)alternative_node_queue.c.
                                     super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_start) !=
             alternative_node_queue.c.
             super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
        pData_ptr = (void *)(ulong)uVar7;
        params.m_p[(long)pData_ptr].main_node =
             ((pointer)
             CONCAT44(alternative_node_queue.c.
                      super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                      (uint)alternative_node_queue.c.
                            super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start))->m_index;
        params.m_p[(long)pData_ptr].alternative_node = uVar10;
        params.m_p[(long)pData_ptr].max_splits = uVar12;
        task_pool::
        queue_object_task<crnlib::tree_clusterizer<crnlib::vec<2u,float>>,void(crnlib::tree_clusterizer<crnlib::vec<2u,float>>::*)(unsigned_long_long,void*)>
                  (pTask_pool,local_120,0x16a954,0,pData_ptr);
        std::
        priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
        ::pop(&alternative_node_queue);
        uVar10 = uVar10 + uVar12 * 2;
        uVar7 = uVar7 + 1;
      }
      task_pool::join(pTask_pool);
      vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::split_alternative_node_task_params>
      ::~vector(&params);
      std::
      _Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
      ::~_Vector_base((_Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                       *)&alternative_node_queue);
      uVar11 = (uint)local_108;
    }
  }
  uVar8 = uVar8 - 1;
  do {
    uVar8 = uVar8 + 1;
    if (uVar11 <= uVar8) break;
    bVar5 = split_node(local_120,&node_queue,&end_node,pTask_pool);
  } while (bVar5);
  this_01 = &local_120->m_node_index_map;
  dVar14 = 0.0;
  while ((ulong)dVar14 < (ulong)end_node) {
    pvVar9 = this_02->m_p;
    local_110 = dVar14;
    if ((pvVar9[(long)dVar14].m_alternative != false) || (pvVar9[(long)dVar14].m_left == -1)) {
      pvVar9 = pvVar9 + (long)dVar14;
      pvVar9->m_codebook_index = (local_120->m_codebook).m_size;
      vector<crnlib::vec<2U,_float>_>::push_back(&this->m_codebook,&pvVar9->m_centroid);
      if ((char)local_100 != '\0') {
        for (uVar6 = (ulong)pvVar9->m_begin; uVar6 < pvVar9->m_end; uVar6 = uVar6 + 1) {
          std::pair<crnlib::vec<2U,_float>,_int>::pair<crnlib::vec<2U,_float>_&,_int_&,_true>
                    (&local_3c,local_120->m_vectors + (local_120->m_vectorsInfo).m_p[uVar6].index,
                     &pvVar9->m_codebook_index);
          std::pair<crnlib::vec<2U,_float>,_unsigned_int>::pair<crnlib::vec<2U,_float>,_int,_true>
                    ((pair<crnlib::vec<2U,_float>,_unsigned_int> *)&params,&local_3c);
          hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
          ::insert((insert_result *)&alternative_node_queue,this_01,(value_type *)&params);
        }
      }
    }
    dVar14 = (double)((long)local_110 + 1);
  }
  std::
  _Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ::~_Vector_base((_Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                   *)&node_queue);
  return;
}

Assistant:

void generate_codebook(VectorType* vectors, uint* weights, uint size, uint max_splits, bool generate_node_index_map = false, task_pool* pTask_pool = 0)
        {
            m_vectors = vectors;
            m_vectorsInfo.resize(size);
            m_weightedVectors.resize(size);
            m_weightedDotProducts.resize(size);
            m_vectorsInfoLeft.resize(size);
            m_vectorsInfoRight.resize(size);
            m_vectorComparison.resize(size);
            m_nodes.resize(max_splits << 2);
            m_codebook.clear();
            uint num_tasks = pTask_pool ? pTask_pool->get_num_threads() + 1 : 1;

            vq_node root;
            root.m_begin = 0;
            root.m_end = size;
            double ttsum = 0.0f;
            for (uint i = 0; i < m_vectorsInfo.size(); i++)
            {
                const VectorType& v = vectors[i];
                m_vectorsInfo[i].index = i;
                const uint weight = m_vectorsInfo[i].weight = weights[i];
                m_weightedVectors[i] = v * (float)weight;
                root.m_centroid += m_weightedVectors[i];
                root.m_total_weight += weight;
                m_weightedDotProducts[i] = v.dot(v) * weight;
                ttsum += m_weightedDotProducts[i];
            }
            root.m_variance = (float)(ttsum - (root.m_centroid.dot(root.m_centroid) / root.m_total_weight));
            root.m_centroid *= (1.0f / root.m_total_weight);

            std::priority_queue<NodeInfo> node_queue;
            uint begin_node = 0, end_node = begin_node, splits = 0;
            m_nodes[end_node] = root;
            node_queue.push(NodeInfo(end_node, root.m_variance));
            end_node++;
            splits++;

            if (num_tasks > 1)
            {
                while (splits < max_splits && node_queue.size() != num_tasks && split_node(node_queue, end_node, pTask_pool))
                {
                    splits++;
                }
                if (node_queue.size() == num_tasks)
                {
                    std::priority_queue<NodeInfo> alternative_node_queue = node_queue;
                    uint alternative_node = max_splits << 1, alternative_max_splits = max_splits / num_tasks;
                    crnlib::vector<split_alternative_node_task_params> params(num_tasks);
                    for (uint task = 0; !alternative_node_queue.empty(); alternative_node_queue.pop(), alternative_node += alternative_max_splits << 1, task++)
                    {
                        params[task].main_node = alternative_node_queue.top().m_index;
                        params[task].alternative_node = alternative_node;
                        params[task].max_splits = alternative_max_splits;
                        pTask_pool->queue_object_task(this, &tree_clusterizer::split_alternative_node_task, task, &params[task]);
                    }
                    pTask_pool->join();
                }
            }

            while (splits < max_splits && split_node(node_queue, end_node, pTask_pool))
            {
                splits++;
            }

            for (uint i = begin_node; i < end_node; i++)
            {
                vq_node& node = m_nodes[i];
                if (!node.m_alternative && node.m_left != -1)
                {
                    continue;
                }
                node.m_codebook_index = m_codebook.size();
                m_codebook.push_back(node.m_centroid);
                if (generate_node_index_map)
                {
                    for (uint j = node.m_begin; j < node.m_end; j++)
                    {
                        m_node_index_map.insert(std::make_pair(m_vectors[m_vectorsInfo[j].index], node.m_codebook_index));
                    }
                }
            }
        }